

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O1

nullres nullcBindModuleFunction(char *module,_func_void *ptr,char *name,int index)

{
  if (NULLC::initialized == '\0') {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
  }
  return '\0';
}

Assistant:

nullres	nullcBindModuleFunction(const char* module, void (*ptr)(), const char* name, int index)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(false);

#if !defined(NULLC_NO_RAW_EXTERNAL_CALL)
	TRACE_SCOPE("nullc", "nullcBindModuleFunction");
	TRACE_LABEL(module);

	assert(!compilerCtx);

	const char *errorPos = NULL;

	if(!AddModuleFunction(&allocator, module, ptr, NULL, NULL, name, index, &errorPos, errorBuf, NULLC_ERROR_BUFFER_SIZE, NULLC::optimizationLevel))
	{
		allocator.Clear();

		nullcLastError = errorBuf;

		return false;
	}

	allocator.Clear();

	return true;
#else
	return false;
#endif
}